

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O3

SizeT PPC_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  byte bVar1;
  SizeT SVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (size < 4) {
    return 0;
  }
  iVar3 = -ip;
  SVar2 = 0;
  do {
    if ((data[SVar2] & 0xfc) == 0x48) {
      bVar1 = data[SVar2 + 3];
      if ((bVar1 & 3) == 1) {
        iVar4 = ip + (int)SVar2;
        if (encoding == 0) {
          iVar4 = iVar3;
        }
        iVar5 = iVar4 + (bVar1 & 0xfffffffc) + (data[SVar2] & 3) * 0x1000000;
        iVar4 = (uint)data[SVar2 + 2] * 0x100 + (uint)data[SVar2 + 1] * 0x10000 + iVar5;
        data[SVar2] = (byte)((uint)iVar4 >> 0x18) & 3 | 0x48;
        data[SVar2 + 1] = (Byte)((uint)iVar4 >> 0x10);
        data[SVar2 + 2] = (Byte)((uint)iVar4 >> 8);
        data[SVar2 + 3] = (byte)iVar5 | bVar1 & 3;
      }
    }
    SVar2 = SVar2 + 4;
    iVar3 = iVar3 + -4;
  } while (SVar2 <= size - 4);
  return SVar2;
}

Assistant:

SizeT PPC_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 4)
    return 0;
  size -= 4;
  for (i = 0; i <= size; i += 4)
  {
    if ((data[i] >> 2) == 0x12 && (data[i + 3] & 3) == 1)
    {
      UInt32 src = ((UInt32)(data[i + 0] & 3) << 24) |
        ((UInt32)data[i + 1] << 16) |
        ((UInt32)data[i + 2] << 8) |
        ((UInt32)data[i + 3] & (~3));
      
      UInt32 dest;
      if (encoding)
        dest = ip + (UInt32)i + src;
      else
        dest = src - (ip + (UInt32)i);
      data[i + 0] = (Byte)(0x48 | ((dest >> 24) &  0x3));
      data[i + 1] = (Byte)(dest >> 16);
      data[i + 2] = (Byte)(dest >> 8);
      data[i + 3] &= 0x3;
      data[i + 3] |= dest;
    }
  }
  return i;
}